

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O1

bool __thiscall
raptor::anon_unknown_5::DoSplitHostPort
          (anon_unknown_5 *this,StringView name,StringView *host,StringView *port,bool *has_port)

{
  char *pcVar1;
  void *pvVar2;
  char *pcVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  anon_unknown_5 *__s;
  
  puVar4 = (undefined8 *)name._size;
  pcVar7 = name._ptr;
  *(undefined1 *)&port->_ptr = 0;
  if (*this != (anon_unknown_5)0x5b) {
    if (pcVar7 == (char *)0x0) {
      pcVar5 = (char *)0xffffffffffffffff;
    }
    else {
      pvVar2 = memchr(this,0x3a,(size_t)pcVar7);
      pcVar5 = (char *)(-(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)this);
    }
    if (pcVar5 != (char *)0xffffffffffffffff) {
      pcVar1 = pcVar5 + 1;
      pcVar6 = pcVar7 + -(long)pcVar1;
      if ((pcVar7 < pcVar1 || pcVar6 == (char *)0x0) ||
         (pvVar2 = memchr(this + (long)pcVar1,0x3a,(size_t)pcVar6),
         pvVar2 == (void *)0x0 || (long)pvVar2 - (long)this == -1)) {
        pcVar3 = pcVar5;
        if (pcVar7 < pcVar5) {
          pcVar3 = pcVar7;
        }
        *puVar4 = this;
        puVar4[1] = pcVar3;
        pcVar3 = pcVar7 + ~(ulong)pcVar5;
        if (pcVar6 < pcVar7 + ~(ulong)pcVar5) {
          pcVar3 = pcVar6;
        }
        host->_ptr = pcVar1 + (long)this;
        host->_size = (size_t)pcVar3;
        *(undefined1 *)&port->_ptr = 1;
        return true;
      }
    }
    *puVar4 = this;
    puVar4[1] = pcVar7;
    host->_ptr = (char *)0x0;
    host->_size = 0;
    return true;
  }
  pcVar5 = (char *)0xffffffffffffffff;
  if ((char *)0x1 < pcVar7) {
    pvVar2 = memchr(this + 1,0x5d,(size_t)(pcVar7 + -1));
    pcVar5 = (char *)(-(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)this);
  }
  if (pcVar5 != (char *)0xffffffffffffffff) {
    pcVar1 = pcVar7 + -1;
    if (pcVar5 == pcVar1) {
      host->_ptr = (char *)0x0;
      host->_size = 0;
    }
    else {
      if ((this + 1)[(long)pcVar5] != (anon_unknown_5)0x3a) {
        return false;
      }
      pcVar6 = pcVar7 + -(long)(pcVar5 + 2);
      if (pcVar7 + (-2 - (long)pcVar5) <= pcVar7 + -(long)(pcVar5 + 2)) {
        pcVar6 = pcVar7 + (-2 - (long)pcVar5);
      }
      host->_ptr = (char *)(this + (long)pcVar5 + 2);
      host->_size = (size_t)pcVar6;
      *(undefined1 *)&port->_ptr = 1;
    }
    __s = this + 1;
    pcVar7 = pcVar5 + -1;
    if (pcVar1 < pcVar5 + -1) {
      pcVar7 = pcVar1;
    }
    *puVar4 = __s;
    puVar4[1] = pcVar7;
    if ((pcVar7 != (char *)0x0) &&
       (pvVar2 = memchr(__s,0x3a,(size_t)pcVar7),
       (long)pvVar2 - (long)__s != -1 && pvVar2 != (void *)0x0)) {
      return true;
    }
    *puVar4 = 0;
    puVar4[1] = 0;
  }
  return false;
}

Assistant:

bool DoSplitHostPort(StringView name, StringView* host, StringView* port,
                     bool* has_port) {
    *has_port = false;
    if (name[0] == '[') {
        /* Parse a bracketed host, typically an IPv6 literal. */
        const size_t rbracket = name.find(']', 1);
        if (rbracket == StringView::npos) {
            /* Unmatched [ */
            return false;
        }
        if (rbracket == name.size() - 1) {
            /* ]<end> */
            *port = StringView();
        } else if (name[rbracket + 1] == ':') {
            /* ]:<port?> */
            *port = name.substr(rbracket + 2, name.size() - rbracket - 2);
            *has_port = true;
        } else {
            /* ]<invalid> */
            return false;
        }
        *host = name.substr(1, rbracket - 1);
        if (host->find(':') == StringView::npos) {
            /* Require all bracketed hosts to contain a colon, because a hostname or
                IPv4 address should never use brackets. */
            *host = StringView();
            return false;
        }
    } else {
        size_t colon = name.find(':');
        if (colon != StringView::npos &&
            name.find(':', colon + 1) == StringView::npos) {
            /* Exactly 1 colon.  Split into host:port. */
            *host = name.substr(0, colon);
            *port = name.substr(colon + 1, name.size() - colon - 1);
            *has_port = true;
        } else {
            /* 0 or 2+ colons.  Bare hostname or IPv6 litearal. */
            *host = name;
            *port = StringView();
        }
    }
    return true;
}